

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.cpp
# Opt level: O3

void calc<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
               (string *Ja_in,string *Jb_in,string *Jc_in)

{
  long lVar1;
  long *plVar2;
  ostream *poVar3;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_R8;
  real_t Jc;
  real_t Jb;
  real_t Ja;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  tc;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_2b8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_268;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_218;
  tc local_1c8 [8];
  uint auStack_1c0 [2];
  uint local_1b8 [2];
  uint auStack_1b0 [2];
  uint local_1a8 [2];
  uint auStack_1a0 [2];
  uint local_198 [2];
  undefined8 uStack_190;
  int local_188;
  undefined1 local_184;
  fpclass_type local_180;
  int32_t iStack_17c;
  cpp_dec_float<100U,_int,_void> local_178;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_80;
  
  local_d8.fpclass = cpp_dec_float_finite;
  local_d8.prec_elem = 0x10;
  local_d8.data._M_elems[0] = 0;
  local_d8.data._M_elems[1] = 0;
  local_d8.data._M_elems[2] = 0;
  local_d8.data._M_elems[3] = 0;
  local_d8.data._M_elems[4] = 0;
  local_d8.data._M_elems[5] = 0;
  local_d8.data._M_elems[6] = 0;
  local_d8.data._M_elems[7] = 0;
  local_d8.data._M_elems[8] = 0;
  local_d8.data._M_elems[9] = 0;
  local_d8.data._M_elems[10] = 0;
  local_d8.data._M_elems[0xb] = 0;
  local_d8.data._M_elems[0xc] = 0;
  local_d8.data._M_elems[0xd] = 0;
  local_d8.data._M_elems._56_5_ = 0;
  local_d8.data._M_elems[0xf]._1_3_ = 0;
  local_d8.exp = 0;
  local_d8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::rd_string
            (&local_d8,(Ja_in->_M_dataplus)._M_p);
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 0x10;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems[6] = 0;
  local_128.data._M_elems[7] = 0;
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  local_128.data._M_elems[10] = 0;
  local_128.data._M_elems[0xb] = 0;
  local_128.data._M_elems[0xc] = 0;
  local_128.data._M_elems[0xd] = 0;
  local_128.data._M_elems._56_5_ = 0;
  local_128.data._M_elems[0xf]._1_3_ = 0;
  local_128.exp = 0;
  local_128.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::rd_string
            (&local_128,(Jb_in->_M_dataplus)._M_p);
  local_178.fpclass = cpp_dec_float_finite;
  local_178.prec_elem = 0x10;
  local_178.data._M_elems[0] = 0;
  local_178.data._M_elems[1] = 0;
  local_178.data._M_elems[2] = 0;
  local_178.data._M_elems[3] = 0;
  local_178.data._M_elems[4] = 0;
  local_178.data._M_elems[5] = 0;
  local_178.data._M_elems[6] = 0;
  local_178.data._M_elems[7] = 0;
  local_178.data._M_elems[8] = 0;
  local_178.data._M_elems[9] = 0;
  local_178.data._M_elems[10] = 0;
  local_178.data._M_elems[0xb] = 0;
  local_178.data._M_elems[0xc] = 0;
  local_178.data._M_elems[0xd] = 0;
  local_178.data._M_elems._56_5_ = 0;
  local_178.data._M_elems[0xf]._1_3_ = 0;
  local_178.exp = 0;
  local_178.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::rd_string
            (&local_178,(Jc_in->_M_dataplus)._M_p);
  uStack_190 = CONCAT35(local_d8.data._M_elems[0xf]._1_3_,local_d8.data._M_elems._56_5_);
  local_1c8 = (tc  [8])local_d8.data._M_elems._0_8_;
  auStack_1c0[0] = local_d8.data._M_elems[2];
  auStack_1c0[1] = local_d8.data._M_elems[3];
  local_1b8[0] = local_d8.data._M_elems[4];
  local_1b8[1] = local_d8.data._M_elems[5];
  auStack_1b0[0] = local_d8.data._M_elems[6];
  auStack_1b0[1] = local_d8.data._M_elems[7];
  local_1a8[0] = local_d8.data._M_elems[8];
  local_1a8[1] = local_d8.data._M_elems[9];
  auStack_1a0[0] = local_d8.data._M_elems[10];
  auStack_1a0[1] = local_d8.data._M_elems[0xb];
  local_198[0] = local_d8.data._M_elems[0xc];
  local_198[1] = local_d8.data._M_elems[0xd];
  local_188 = local_d8.exp;
  local_184 = local_d8.neg;
  local_180 = local_d8.fpclass;
  iStack_17c = local_d8.prec_elem;
  local_218.base.m_backend.data._M_elems[0xf]._1_3_ = local_128.data._M_elems[0xf]._1_3_;
  local_218.base.m_backend.data._M_elems._56_5_ = local_128.data._M_elems._56_5_;
  local_218.base.m_backend.data._M_elems[0] = local_128.data._M_elems[0];
  local_218.base.m_backend.data._M_elems[1] = local_128.data._M_elems[1];
  local_218.base.m_backend.data._M_elems[2] = local_128.data._M_elems[2];
  local_218.base.m_backend.data._M_elems[3] = local_128.data._M_elems[3];
  local_218.base.m_backend.data._M_elems[4] = local_128.data._M_elems[4];
  local_218.base.m_backend.data._M_elems[5] = local_128.data._M_elems[5];
  local_218.base.m_backend.data._M_elems[6] = local_128.data._M_elems[6];
  local_218.base.m_backend.data._M_elems[7] = local_128.data._M_elems[7];
  local_218.base.m_backend.data._M_elems[8] = local_128.data._M_elems[8];
  local_218.base.m_backend.data._M_elems[9] = local_128.data._M_elems[9];
  local_218.base.m_backend.data._M_elems[10] = local_128.data._M_elems[10];
  local_218.base.m_backend.data._M_elems[0xb] = local_128.data._M_elems[0xb];
  local_218.base.m_backend.data._M_elems[0xc] = local_128.data._M_elems[0xc];
  local_218.base.m_backend.data._M_elems[0xd] = local_128.data._M_elems[0xd];
  local_218.base.m_backend.exp = local_128.exp;
  local_218.base.m_backend.neg = local_128.neg;
  local_218.base.m_backend.fpclass = local_128.fpclass;
  local_218.base.m_backend.prec_elem = local_128.prec_elem;
  local_268.base.m_backend.data._M_elems[0xf]._1_3_ = local_178.data._M_elems[0xf]._1_3_;
  local_268.base.m_backend.data._M_elems._56_5_ = local_178.data._M_elems._56_5_;
  local_268.base.m_backend.data._M_elems[0] = local_178.data._M_elems[0];
  local_268.base.m_backend.data._M_elems[1] = local_178.data._M_elems[1];
  local_268.base.m_backend.data._M_elems[2] = local_178.data._M_elems[2];
  local_268.base.m_backend.data._M_elems[3] = local_178.data._M_elems[3];
  local_268.base.m_backend.data._M_elems[4] = local_178.data._M_elems[4];
  local_268.base.m_backend.data._M_elems[5] = local_178.data._M_elems[5];
  local_268.base.m_backend.data._M_elems[6] = local_178.data._M_elems[6];
  local_268.base.m_backend.data._M_elems[7] = local_178.data._M_elems[7];
  local_268.base.m_backend.data._M_elems[8] = local_178.data._M_elems[8];
  local_268.base.m_backend.data._M_elems[9] = local_178.data._M_elems[9];
  local_268.base.m_backend.data._M_elems[10] = local_178.data._M_elems[10];
  local_268.base.m_backend.data._M_elems[0xb] = local_178.data._M_elems[0xb];
  local_268.base.m_backend.data._M_elems[0xc] = local_178.data._M_elems[0xc];
  local_268.base.m_backend.data._M_elems[0xd] = local_178.data._M_elems[0xd];
  local_268.base.m_backend.exp = local_178.exp;
  local_268.base.m_backend.neg = local_178.neg;
  local_268.base.m_backend.fpclass = local_178.fpclass;
  local_268.base.m_backend.prec_elem = local_178.prec_elem;
  ising::tc::
  triangular<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (&local_80,local_1c8,&local_218,&local_268,in_R8);
  lVar1 = std::cout;
  *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xfffffefb | 0x100;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 100;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"# lattice: triangular\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# precision: ",0xd);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,100);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"# Ja Jb Jc Tc 1/Tc",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  poVar3 = boost::multiprecision::operator<<
                     (poVar3,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                              *)&local_d8);
  local_2b8.base.m_backend.data._M_elems[0]._0_1_ = 0x20;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_2b8,1);
  poVar3 = boost::multiprecision::operator<<
                     (poVar3,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                              *)&local_128);
  local_2b8.base.m_backend.data._M_elems[0]._0_1_ = 0x20;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_2b8,1);
  poVar3 = boost::multiprecision::operator<<
                     (poVar3,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                              *)&local_178);
  local_2b8.base.m_backend.data._M_elems[0]._0_1_ = 0x20;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_2b8,1);
  poVar3 = boost::multiprecision::operator<<(poVar3,&local_80.base);
  local_2b8.base.m_backend.data._M_elems[0]._0_1_ = 0x20;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_2b8,1);
  operator/(&local_2b8,1,&local_80);
  poVar3 = boost::multiprecision::operator<<(poVar3,&local_2b8.base);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void calc(const std::string& Ja_in, const std::string& Jb_in, const std::string& Jc_in) {
  typedef T real_t;
  real_t Ja = convert<real_t>(Ja_in);
  real_t Jb = convert<real_t>(Jb_in);
  real_t Jc = convert<real_t>(Jc_in);
  auto tc = ising::tc::triangular(Ja, Jb, Jc);
  std::cout << std::scientific << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: triangular\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10 << std::endl
            << "# Ja Jb Jc Tc 1/Tc" << std::endl
            << Ja << ' ' << Jb << ' ' << Jc << ' ' << tc << ' ' << (1 / tc) << std::endl;
}